

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

vector4 * vector4_normalize(vector4 *self)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  anon_union_16_2_12391dad_for_vector4_0 aVar4;
  
  fVar2 = vector4_magnitude(self);
  fVar3 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar3 = fVar2;
  }
  if (1e-05 <= fVar3) {
    auVar1._4_4_ = fVar2;
    auVar1._0_4_ = fVar2;
    auVar1._8_4_ = fVar2;
    auVar1._12_4_ = fVar2;
    aVar4.v = (float  [4])divps(self->field_0,auVar1);
    self->field_0 = aVar4;
  }
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_normalize(struct vector4 *self)
{
	HYP_FLOAT mag;

	mag = vector4_magnitude(self);

	if (scalar_equalsf(mag, 0.0)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;
	self->w = self->w / mag;

	return self;
}